

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O3

int32_t icu_63::anon_unknown_10::toLower
                  (int32_t caseLocale,uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,
                  UCaseContext *csc,int32_t srcStart,int32_t srcLimit,Edits *edits,
                  UErrorCode *errorCode)

{
  char cVar1;
  UChar UVar2;
  ushort uVar3;
  int result;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 *local_58;
  UChar *s;
  UCaseContext *local_48;
  ulong local_40;
  UTrie2 *local_38;
  
  local_58 = LatinCase::TO_LOWER_NORMAL;
  if (caseLocale != 1) {
    if (caseLocale < 0) {
      if ((options & 7) == 0) goto LAB_002ef7ad;
    }
    else if ((caseLocale & 0x7ffffffeU) != 2) goto LAB_002ef7ad;
    local_58 = LatinCase::TO_LOWER_TR_LT;
  }
LAB_002ef7ad:
  local_48 = csc;
  local_38 = ucase_getTrie_63();
  uVar4 = 0;
  uVar5 = srcStart;
  do {
    do {
      if (srcStart < srcLimit) {
        do {
          UVar2 = src[srcStart];
          uVar6 = (uint)(ushort)UVar2;
          if ((ushort)UVar2 < 0x17f) {
            cVar1 = local_58[(ushort)UVar2];
            uVar8 = (uint)cVar1;
            if (cVar1 == -0x80) break;
            uVar6 = (uint)(ushort)UVar2;
            if (cVar1 != '\0') {
LAB_002ef86b:
              uVar6 = ~uVar5 + srcStart + 1U;
              uVar9 = uVar4;
              if (0 < (int)uVar6) {
                if (edits != (Edits *)0x0) {
                  Edits::addUnchanged(edits,uVar6);
                }
                if ((options >> 0xe & 1) == 0) {
                  if ((uVar4 ^ 0x7fffffff) < uVar6) goto LAB_002efb2e;
                  uVar9 = uVar4 + uVar6;
                  if ((int)uVar9 <= destCapacity) {
                    u_memcpy_63(dest + (int)uVar4,src + (int)uVar5,uVar6);
                  }
                }
              }
              if ((int)uVar9 < 0) goto LAB_002efb2e;
              uVar6 = uVar8 + (ushort)UVar2;
              if ((int)uVar9 < destCapacity) {
                dest[uVar9] = (UChar)uVar6;
LAB_002ef90f:
                uVar4 = uVar9 + 1;
              }
              else {
                uVar4 = 0xffffffff;
                if (uVar9 != 0x7fffffff) goto LAB_002ef90f;
              }
              if (edits != (Edits *)0x0) {
                Edits::addReplace(edits,1,1);
              }
              uVar5 = srcStart + 1U;
              if ((int)uVar4 < 0) goto LAB_002efb2e;
            }
          }
          else {
            if ((0xd7ff < (ushort)UVar2) ||
               (uVar3 = local_38->index
                        [((ushort)UVar2 & 0x1f) + (uint)local_38->index[(ushort)UVar2 >> 5] * 4],
               (uVar3 & 8) != 0)) break;
            uVar6 = (uint)(ushort)UVar2;
            if (0x7f < uVar3 && (uVar3 & 2) != 0) {
              uVar8 = (uint)(int)(short)uVar3 >> 7;
              goto LAB_002ef86b;
            }
          }
          srcStart = srcStart + 1;
        } while (srcStart < srcLimit);
        uVar6 = uVar6 & 0xffff;
        uVar8 = srcStart;
      }
      else {
        uVar6 = 0;
        uVar8 = srcStart;
      }
      uVar7 = (ulong)uVar8;
      if (srcLimit <= (int)uVar8) {
        uVar9 = uVar8 - uVar5;
        uVar6 = uVar4;
        if (uVar9 != 0 && (int)uVar5 <= (int)uVar8) {
          if (edits != (Edits *)0x0) {
            Edits::addUnchanged(edits,uVar9);
          }
          if ((options >> 0xe & 1) == 0) {
            if ((uVar4 ^ 0x7fffffff) < uVar9) goto LAB_002efb2e;
            uVar6 = uVar9 + uVar4;
            if ((int)uVar6 <= destCapacity) {
              u_memcpy_63(dest + (int)uVar4,src + (int)uVar5,uVar9);
            }
          }
        }
        if (-1 < (int)uVar6) {
          return uVar6;
        }
        goto LAB_002efb2e;
      }
      srcStart = uVar8 + 1;
      if ((((uVar6 & 0xfc00) == 0xd800) && (srcStart < srcLimit)) &&
         (((ushort)src[srcStart] & 0xfc00) == 0xdc00)) {
        uVar6 = uVar6 * 0x400 + (uint)(ushort)src[srcStart] + 0xfca02400;
        srcStart = uVar8 + 2;
      }
      if (caseLocale < 0) {
        result = ucase_toFullFolding_63(uVar6,&s,options);
      }
      else {
        local_48->cpStart = uVar8;
        local_48->cpLimit = srcStart;
        result = ucase_toFullLower_63(uVar6,utf16_caseContextIterator,local_48,&s,caseLocale);
      }
    } while (result < 0);
    uVar9 = uVar8 - uVar5;
    uVar6 = uVar4;
    local_40 = uVar7;
    if (uVar9 != 0 && (int)uVar5 <= (int)uVar8) {
      if (edits != (Edits *)0x0) {
        Edits::addUnchanged(edits,uVar9);
      }
      if ((options >> 0xe & 1) == 0) {
        if ((uVar4 ^ 0x7fffffff) < uVar9) break;
        uVar6 = uVar4 + uVar9;
        if ((int)uVar6 <= destCapacity) {
          u_memcpy_63(dest + (int)uVar4,src + (int)uVar5,uVar9);
        }
      }
    }
    if ((int)uVar6 < 0) break;
    uVar4 = appendResult(dest,uVar6,destCapacity,result,s,srcStart - (int)local_40,options,edits);
    uVar5 = srcStart;
  } while (-1 < (int)uVar4);
LAB_002efb2e:
  *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return 0;
}

Assistant:

int32_t toLower(int32_t caseLocale, uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, UCaseContext *csc, int32_t srcStart, int32_t srcLimit,
                icu::Edits *edits, UErrorCode &errorCode) {
    const int8_t *latinToLower;
    if (caseLocale == UCASE_LOC_ROOT ||
            (caseLocale >= 0 ?
                !(caseLocale == UCASE_LOC_TURKISH || caseLocale == UCASE_LOC_LITHUANIAN) :
                (options & _FOLD_CASE_OPTIONS_MASK) == U_FOLD_CASE_DEFAULT)) {
        latinToLower = LatinCase::TO_LOWER_NORMAL;
    } else {
        latinToLower = LatinCase::TO_LOWER_TR_LT;
    }
    const UTrie2 *trie = ucase_getTrie();
    int32_t destIndex = 0;
    int32_t prev = srcStart;
    int32_t srcIndex = srcStart;
    for (;;) {
        // fast path for simple cases
        UChar lead = 0;
        while (srcIndex < srcLimit) {
            lead = src[srcIndex];
            int32_t delta;
            if (lead < LatinCase::LONG_S) {
                int8_t d = latinToLower[lead];
                if (d == LatinCase::EXC) { break; }
                ++srcIndex;
                if (d == 0) { continue; }
                delta = d;
            } else if (lead >= 0xd800) {
                break;  // surrogate or higher
            } else {
                uint16_t props = UTRIE2_GET16_FROM_U16_SINGLE_LEAD(trie, lead);
                if (UCASE_HAS_EXCEPTION(props)) { break; }
                ++srcIndex;
                if (!UCASE_IS_UPPER_OR_TITLE(props) || (delta = UCASE_GET_DELTA(props)) == 0) {
                    continue;
                }
            }
            lead += static_cast<UChar>(delta);
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, srcIndex - 1 - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendUChar(dest, destIndex, destCapacity, lead);
                if (edits != nullptr) {
                    edits->addReplace(1, 1);
                }
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
        if (srcIndex >= srcLimit) {
            break;
        }
        // slow path
        int32_t cpStart = srcIndex++;
        UChar trail;
        UChar32 c;
        if (U16_IS_LEAD(lead) && srcIndex < srcLimit && U16_IS_TRAIL(trail = src[srcIndex])) {
            c = U16_GET_SUPPLEMENTARY(lead, trail);
            ++srcIndex;
        } else {
            c = lead;
        }
        const UChar *s;
        if (caseLocale >= 0) {
            csc->cpStart = cpStart;
            csc->cpLimit = srcIndex;
            c = ucase_toFullLower(c, utf16_caseContextIterator, csc, &s, caseLocale);
        } else {
            c = ucase_toFullFolding(c, &s, options);
        }
        if (c >= 0) {
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, cpStart - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                         srcIndex - cpStart, options, edits);
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
    }
    destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                src + prev, srcIndex - prev, options, edits);
    if (destIndex < 0) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    return destIndex;
}